

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_multi_var
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  code *pcVar4;
  secp256k1_scalar *psVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong local_d0;
  secp256k1_gej tmp;
  
  secp256k1_gej_set_infinity(r);
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n != 0) {
    if (n != 0) {
      if ((scratch != (secp256k1_scratch *)0x0) &&
         (sVar2 = secp256k1_pippenger_max_points(error_callback,scratch), sVar2 != 0)) {
        uVar3 = 5000000;
        if (sVar2 < 5000000) {
          uVar3 = sVar2;
        }
        uVar7 = n - 1;
        local_d0 = uVar7 / uVar3 + 1;
        uVar3 = uVar7 / local_d0;
        if (uVar3 < 0x57) {
          sVar2 = secp256k1_scratch_max_allocation(error_callback,scratch,5);
          if (sVar2 < 0x988) goto LAB_00137048;
          uVar3 = 5000000;
          if (sVar2 / 0x988 < 5000000) {
            uVar3 = sVar2 / 0x988;
          }
          local_d0 = uVar7 / uVar3 + 1;
          uVar3 = uVar7 / local_d0;
          pcVar4 = secp256k1_ecmult_strauss_batch;
        }
        else {
          pcVar4 = secp256k1_ecmult_pippenger_batch;
        }
        uVar3 = uVar3 + 1;
        lVar8 = 0;
        uVar7 = 0;
        while( true ) {
          if (local_d0 == uVar7) {
            return 1;
          }
          uVar6 = uVar3;
          if (n < uVar3) {
            uVar6 = n;
          }
          psVar5 = (secp256k1_scalar *)0x0;
          if (uVar7 == 0) {
            psVar5 = inp_g_sc;
          }
          iVar1 = (*pcVar4)(error_callback,scratch,&tmp,psVar5,cb,cbdata,uVar6,lVar8);
          if (iVar1 == 0) break;
          secp256k1_gej_add_var(r,r,&tmp,(secp256k1_fe *)0x0);
          n = n - uVar6;
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + uVar3;
        }
        return 0;
      }
LAB_00137048:
      iVar1 = secp256k1_ecmult_multi_simple_var(r,inp_g_sc,cb,cbdata,n);
      return iVar1;
    }
    secp256k1_ecmult(r,r,&secp256k1_scalar_zero,inp_g_sc);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_callback* error_callback, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_ecmult(r, r, &secp256k1_scalar_zero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }

    /* Compute the batch sizes for Pippenger's algorithm given a scratch space. If it's greater than
     * a threshold use Pippenger's algorithm. Otherwise use Strauss' algorithm.
     * As a first step check if there's enough space for Pippenger's algo (which requires less space
     * than Strauss' algo) and if not, use the simple algorithm. */
    if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_pippenger_max_points(error_callback, scratch), n)) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }
    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_strauss_max_points(error_callback, scratch), n)) {
            return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
        }
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(error_callback, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}